

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O3

void calc_inventory(player *p)

{
  wchar_t *pwVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  wchar_t wVar5;
  _Bool _Var6;
  wchar_t wVar7;
  uint uVar8;
  object **p_00;
  void *p_01;
  char *p_02;
  object **ppoVar9;
  object *poVar10;
  object *poVar11;
  angband_constants *paVar12;
  player_upkeep *ppVar13;
  object **ppoVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  wchar_t amt;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  int local_6c;
  int local_68;
  
  wVar5 = p->upkeep->inven_cnt;
  uVar3 = z_info->pack_size;
  wVar7 = pack_slots_used(p);
  iVar17 = (uint)z_info->pack_size + (uint)z_info->quiver_size;
  uVar4 = (p->body).count;
  uVar18 = (uint)uVar4 + iVar17 + 1;
  uVar16 = (ulong)uVar18;
  p_00 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  p_01 = mem_zalloc((ulong)z_info->pack_size << 3);
  p_02 = (char *)mem_alloc(uVar16);
  poVar11 = p->gear;
  uVar20 = 0;
  if (poVar11 != (object *)0x0) {
    do {
      if (uVar16 == uVar20) {
        __assert_fail("j < n_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                      ,0x46f,"void calc_inventory(struct player *)");
      }
      _Var6 = object_is_equipped(p->body,poVar11);
      p_02[uVar20] = _Var6;
      uVar20 = uVar20 + 1;
      poVar11 = poVar11->next;
    } while (poVar11 != (object *)0x0);
    if (uVar18 <= (uint)uVar20) goto LAB_001b59f9;
  }
  memset(p_02 + (uVar20 & 0xffffffff),0,(ulong)((iVar17 + (uint)uVar4) - (int)uVar20) + 1);
LAB_001b59f9:
  p->upkeep->quiver_cnt = L'\0';
  if (z_info->quiver_size != 0) {
    uVar20 = 0;
    ppoVar14 = p_00;
    do {
      poVar11 = p->upkeep->quiver[uVar20];
      ppoVar9 = ppoVar14;
      if (poVar11 != (object *)0x0) {
        *ppoVar14 = poVar11;
        ppoVar9 = p->upkeep->quiver + uVar20;
      }
      *ppoVar9 = (object *)0x0;
      uVar20 = uVar20 + 1;
      ppoVar14 = ppoVar14 + 1;
    } while (uVar20 < z_info->quiver_size);
  }
  iVar17 = (uint)uVar3 - wVar7;
  poVar11 = p->gear;
  if (poVar11 == (object *)0x0) {
    local_6c = 0;
  }
  else {
    local_6c = 0;
    pcVar19 = p_02;
    do {
      if ((((*pcVar19 == '\0') && (wVar7 = preferred_quiver_slot(poVar11), L'\xffffffff' < wVar7))
          && ((uint)wVar7 < (uint)z_info->quiver_size)) &&
         (p->upkeep->quiver[(uint)wVar7] == (object *)0x0)) {
        _Var6 = tval_is_ammo(poVar11);
        uVar18 = 1;
        if (!_Var6) {
          uVar18 = (uint)z_info->thrown_quiver_mult;
        }
        bVar2 = poVar11->number;
        uVar8 = uVar18 * bVar2;
        uVar3 = z_info->quiver_slot_size;
        if (uVar3 < uVar8) {
          amt = (uint)bVar2 - uVar3 / uVar18;
          if ((uint)bVar2 < uVar3 / uVar18 || amt == L'\0') {
            __assert_fail("nsplit < current->number",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                          ,0x49c,"void calc_inventory(struct player *)");
          }
          if ((uVar3 < uVar18) || (iVar17 < local_6c)) goto LAB_001b5b7a;
          poVar10 = object_split(poVar11,amt);
          gear_insert_end(p,poVar10);
          local_6c = local_6c + 1;
          uVar8 = uVar18 * poVar11->number;
        }
        p->upkeep->quiver[(uint)wVar7] = poVar11;
        pwVar1 = &p->upkeep->quiver_cnt;
        *pwVar1 = *pwVar1 + uVar8;
        *pcVar19 = '\x01';
      }
LAB_001b5b7a:
      poVar11 = poVar11->next;
      pcVar19 = pcVar19 + 1;
    } while (poVar11 != (object *)0x0);
  }
  paVar12 = z_info;
  if (z_info->quiver_size != 0) {
    ppVar13 = p->upkeep;
    uVar20 = 0;
    do {
      if (ppVar13->quiver[uVar20] == (object *)0x0) {
        poVar11 = p->gear;
        if (poVar11 == (object *)0x0) break;
        local_68 = -1;
        uVar15 = 0;
        poVar10 = (object *)0x0;
        do {
          if (uVar16 == uVar15) {
            __assert_fail("j < n_max",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                          ,0x4c8,"void calc_inventory(struct player *)");
          }
          if ((p_02[uVar15] == '\0') && (_Var6 = tval_is_ammo(poVar11), _Var6)) {
            if ((((ushort)poVar11->number <= z_info->quiver_slot_size) ||
                (z_info->quiver_slot_size != 0 && local_6c <= iVar17)) &&
               (_Var6 = earlier_object(poVar10,poVar11,false), _Var6)) {
              local_68 = (int)uVar15;
              poVar10 = poVar11;
            }
          }
          uVar15 = uVar15 + 1;
          poVar11 = poVar11->next;
        } while (poVar11 != (object *)0x0);
        paVar12 = z_info;
        if (poVar10 == (object *)0x0) break;
        bVar2 = poVar10->number;
        uVar3 = z_info->quiver_slot_size;
        wVar7 = (uint)bVar2 - (uint)uVar3;
        if ((uint)uVar3 <= (uint)bVar2 && wVar7 != L'\0') {
          if ((uVar3 == 0) || (iVar17 < local_6c)) {
            __assert_fail("z_info->quiver_slot_size > 0 && n_stack_split <= n_pack_remaining",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                          ,0x4e6,"void calc_inventory(struct player *)");
          }
          poVar11 = object_split(poVar10,wVar7);
          gear_insert_end(p,poVar11);
          bVar2 = poVar10->number;
        }
        p->upkeep->quiver[uVar20] = poVar10;
        ppVar13 = p->upkeep;
        ppVar13->quiver_cnt = ppVar13->quiver_cnt + (uint)bVar2;
        p_02[local_68] = '\x01';
        paVar12 = z_info;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < paVar12->quiver_size);
  }
  if ((character_dungeon == true) && ((ulong)paVar12->quiver_size != 0)) {
    uVar20 = 0;
    do {
      if ((p_00[uVar20] != (object *)0x0) && (p->upkeep->quiver[uVar20] != p_00[uVar20])) {
        msg("You re-arrange your quiver.");
        paVar12 = z_info;
        break;
      }
      uVar20 = uVar20 + 1;
    } while (paVar12->quiver_size != uVar20);
  }
  if (paVar12->pack_size != 0) {
    uVar20 = 0;
    do {
      *(object **)((long)p_01 + uVar20 * 8) = p->upkeep->inven[uVar20];
      uVar20 = uVar20 + 1;
    } while (uVar20 < z_info->pack_size);
  }
  p->upkeep->inven_cnt = L'\0';
  uVar20 = 0;
  do {
    poVar11 = p->gear;
    if (poVar11 == (object *)0x0) {
      p->upkeep->inven[uVar20] = (object *)0x0;
    }
    else {
      uVar21 = 0xffffffff;
      uVar15 = 0;
      poVar10 = (object *)0x0;
      do {
        if (uVar16 == uVar15) {
          __assert_fail("j < n_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x50d,"void calc_inventory(struct player *)");
        }
        if ((p_02[uVar15] == '\0') && (_Var6 = earlier_object(poVar10,poVar11,false), _Var6)) {
          uVar21 = uVar15 & 0xffffffff;
          poVar10 = poVar11;
        }
        uVar15 = uVar15 + 1;
        poVar11 = poVar11->next;
      } while (poVar11 != (object *)0x0);
      p->upkeep->inven[uVar20] = poVar10;
      if (poVar10 != (object *)0x0) {
        pwVar1 = &p->upkeep->inven_cnt;
        *pwVar1 = *pwVar1 + L'\x01';
        p_02[(int)uVar21] = '\x01';
      }
    }
    bVar22 = uVar20 < z_info->pack_size;
    uVar20 = uVar20 + 1;
  } while (bVar22);
  if ((character_dungeon == true) && (z_info->pack_size != 0 && p->upkeep->inven_cnt == wVar5)) {
    uVar16 = 0;
    paVar12 = z_info;
    do {
      poVar11 = *(object **)((long)p_01 + uVar16 * 8);
      if (((poVar11 != (object *)0x0) && (p->upkeep->inven[uVar16] != poVar11)) &&
         (_Var6 = object_is_equipped(p->body,poVar11), paVar12 = z_info, !_Var6)) {
        msg("You re-arrange your pack.");
        break;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < paVar12->pack_size);
  }
  mem_free(p_02);
  mem_free(p_01);
  mem_free(p_00);
  return;
}

Assistant:

void calc_inventory(struct player *p)
{
	int old_inven_cnt = p->upkeep->inven_cnt;
	int n_stack_split = 0;
	int n_pack_remaining = z_info->pack_size - pack_slots_used(p);
	int n_max = 1 + z_info->pack_size + z_info->quiver_size
		+ p->body.count;
	struct object **old_quiver = mem_zalloc(z_info->quiver_size
		* sizeof(*old_quiver));
	struct object **old_pack = mem_zalloc(z_info->pack_size
		* sizeof(*old_pack));
	bool *assigned = mem_alloc(n_max * sizeof(*assigned));
	struct object *current;
	int i, j;

	/*
	 * Equipped items are already taken care of.  Only the others need
	 * to be tested for assignment to the quiver or pack.
	 */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		assert(j < n_max);
		assigned[j] = object_is_equipped(p->body, current);
	}
	for (; j < n_max; ++j) {
		assigned[j] = false;
	}

	/* Prepare to fill the quiver */
	p->upkeep->quiver_cnt = 0;

	/* Copy the current quiver and then leave it empty. */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i]) {
			old_quiver[i] = p->upkeep->quiver[i];
			p->upkeep->quiver[i] = NULL;
		} else {
			old_quiver[i] = NULL;
		}
	}

	/* Fill quiver.  First, allocate inscribed items. */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		int prefslot;

		/* Skip already assigned (i.e. equipped) items. */
		if (assigned[j]) continue;

		prefslot  = preferred_quiver_slot(current);
		if (prefslot >= 0 && prefslot < z_info->quiver_size
				&& !p->upkeep->quiver[prefslot]) {
			/*
			 * The preferred slot is empty.  Split the stack if
			 * necessary.  Don't allow splitting if it could
			 * result in overfilling the pack by more than one slot.
			 */
			int mult = tval_is_ammo(current) ?
				1 : z_info->thrown_quiver_mult;
			struct object *to_quiver;

			if (current->number * mult
					<= z_info->quiver_slot_size) {
				to_quiver = current;
			} else {
				int nsplit = z_info->quiver_slot_size / mult;

				assert(nsplit < current->number);
				if (nsplit > 0 && n_stack_split
						<= n_pack_remaining) {
					/*
					 * Split off the portion that goes to
					 * the pack.  Since the stack in the
					 * quiver is earlier in the gear list it
					 * will prefer to remain in the quiver
					 * in future calls to calc_inventory()
					 * and will be the preferred target for
					 * combine_pack().
					 */
					to_quiver = current;
					gear_insert_end(p, object_split(current,
						current->number - nsplit));
					++n_stack_split;
				} else {
					to_quiver = NULL;
				}
			}

			if (to_quiver) {
				p->upkeep->quiver[prefslot] = to_quiver;
				p->upkeep->quiver_cnt += to_quiver->number * mult;

				/* That part of the gear has been dealt with. */
				assigned[j] = true;
			}
		}
	}

	/* Now fill the rest of the slots in order. */
	for (i = 0; i < z_info->quiver_size; ++i) {
		struct object *first = NULL;
		int jfirst = -1;

		/* If the slot is full, move on. */
		if (p->upkeep->quiver[i]) continue;

		/* Find the quiver object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/*
			 * Only try to assign if not assigned, ammo, and,
			 * if necessary to split, have room for the split
			 * stacks.
			 */
			if (!assigned[j] && tval_is_ammo(current)
					&& (current->number
					<= z_info->quiver_slot_size
					|| (z_info->quiver_slot_size > 0
					&& n_stack_split
					<= n_pack_remaining))) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Stop looking if there's nothing left in the gear. */
		if (!first) break;

		/* Put the item in the slot, splitting (if needed) to fit. */
		if (first->number > z_info->quiver_slot_size) {
			assert(z_info->quiver_slot_size > 0
				&& n_stack_split <= n_pack_remaining);
			/* As above, split off the portion going to the pack. */
			gear_insert_end(p, object_split(first,
				first->number - z_info->quiver_slot_size));
		}
		p->upkeep->quiver[i] = first;
		p->upkeep->quiver_cnt += first->number;

		/* That part of the gear has been dealt with. */
		assigned[jfirst] = true;
	}

	/* Note reordering */
	if (character_dungeon) {
		for (i = 0; i < z_info->quiver_size; i++) {
			if (old_quiver[i] && p->upkeep->quiver[i] != old_quiver[i]) {
				msg("You re-arrange your quiver.");
				break;
			}
		}
	}

	/* Copy the current pack */
	for (i = 0; i < z_info->pack_size; i++) {
		old_pack[i] = p->upkeep->inven[i];
	}

	/* Prepare to fill the inventory */
	p->upkeep->inven_cnt = 0;

	for (i = 0; i <= z_info->pack_size; i++) {
		struct object *first = NULL;
		int jfirst = -1;

		/* Find the object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/* Consider it if it hasn't already been handled. */
			if (!assigned[j]) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Allocate */
		p->upkeep->inven[i] = first;
		if (first) {
			++p->upkeep->inven_cnt;
			assigned[jfirst] = true;
		}
	}

	/* Note reordering */
	if (character_dungeon && p->upkeep->inven_cnt == old_inven_cnt) {
		for (i = 0; i < z_info->pack_size; i++) {
			if (old_pack[i] && p->upkeep->inven[i] != old_pack[i]
					 && !object_is_equipped(p->body, old_pack[i])) {
				msg("You re-arrange your pack.");
				break;
			}
		}
	}

	mem_free(assigned);
	mem_free(old_pack);
	mem_free(old_quiver);
}